

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Color * LoadImageColors(Image image)

{
  uchar uVar1;
  ushort uVar2;
  Color *pCVar3;
  int iVar4;
  long lVar5;
  char *text;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  
  if (image.height == 0 || image.width == 0) {
    return (Color *)0x0;
  }
  uVar7 = image.height * image.width;
  pCVar3 = (Color *)malloc((long)(int)uVar7 << 2);
  if (0xd < image.format) {
    TraceLog(4,"IMAGE: Pixel data retrieval not supported for compressed image formats");
    return pCVar3;
  }
  if (image.format - 8U < 3) {
    text = "IMAGE: Pixel format converted from 32bit to 8bit per channel";
  }
  else {
    if (2 < image.format - 0xbU) goto LAB_0017afcc;
    text = "IMAGE: Pixel format converted from 16bit to 8bit per channel";
  }
  TraceLog(4,text);
LAB_0017afcc:
  uVar6 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar6;
  }
  iVar4 = 0;
  do {
    if (uVar8 == uVar6) {
      return pCVar3;
    }
    if (0xc < image.format - 1U) goto LAB_0017b301;
    lVar5 = (long)iVar4;
    switch(image.format) {
    case 1:
      uVar1 = *(uchar *)((long)image.data + uVar6);
      pCVar3[uVar6].r = uVar1;
      pCVar3[uVar6].g = uVar1;
      pCVar3[uVar6].b = *(uchar *)((long)image.data + uVar6);
      goto LAB_0017b1a4;
    case 2:
      uVar1 = *(uchar *)((long)image.data + lVar5);
      pCVar3[uVar6].r = uVar1;
      pCVar3[uVar6].g = uVar1;
      pCVar3[uVar6].b = *(uchar *)((long)image.data + lVar5);
      pCVar3[uVar6].a = *(uchar *)((long)image.data + lVar5 + 1);
      iVar4 = iVar4 + 2;
      break;
    case 3:
      uVar2 = *(ushort *)((long)image.data + uVar6 * 2);
      pCVar3[uVar6].r = (byte)(uVar2 >> 8) & 0xf8;
      pCVar3[uVar6].g = (byte)(uVar2 >> 3) & 0xfc;
      pCVar3[uVar6].b = (char)uVar2 << 3;
LAB_0017b1a4:
      pCVar3[uVar6].a = 0xff;
      break;
    case 4:
      pCVar3[uVar6].r = *(uchar *)((long)image.data + lVar5);
      pCVar3[uVar6].g = *(uchar *)((long)image.data + lVar5 + 1);
      pCVar3[uVar6].b = *(uchar *)((long)image.data + lVar5 + 2);
      goto LAB_0017b2f6;
    case 5:
      uVar2 = *(ushort *)((long)image.data + uVar6 * 2);
      pCVar3[uVar6].r = (byte)(uVar2 >> 8) & 0xf8;
      pCVar3[uVar6].g = (byte)(uVar2 >> 3) & 0xf8;
      pCVar3[uVar6].b = (byte)uVar2 * '\x04' & 0xf8;
      pCVar3[uVar6].a = -((byte)uVar2 & 1);
      break;
    case 6:
      uVar2 = *(ushort *)((long)image.data + uVar6 * 2);
      uVar7 = (uint)((byte)uVar2 & 0xf) << 0x18 |
              (uint)(byte)((byte)uVar2 >> 4) << 0x10 | uVar2 & 0xf00 | (uint)(uVar2 >> 0xc);
      auVar10 = psllw(ZEXT416(uVar7),4);
      pCVar3[uVar6] = (Color)(auVar10._0_4_ & (uint)DAT_001cb840 | uVar7);
      break;
    case 7:
      pCVar3[uVar6].r = *(uchar *)((long)image.data + lVar5);
      pCVar3[uVar6].g = *(uchar *)((long)image.data + lVar5 + 1);
      pCVar3[uVar6].b = *(uchar *)((long)image.data + lVar5 + 2);
      pCVar3[uVar6].a = *(uchar *)((long)image.data + lVar5 + 3);
      goto LAB_0017b27d;
    case 8:
      fVar9 = *(float *)((long)image.data + lVar5 * 4);
      goto LAB_0017b293;
    case 9:
      pCVar3[uVar6].r = (uchar)(int)(*(float *)((long)image.data + lVar5 * 4) * 255.0);
      pCVar3[uVar6].g = (uchar)(int)(*(float *)((long)image.data + lVar5 * 4 + 4) * 255.0);
      fVar9 = *(float *)((long)image.data + lVar5 * 4 + 8);
      goto LAB_0017b2ed;
    case 10:
      pCVar3[uVar6].r = (uchar)(int)(*(float *)((long)image.data + lVar5 * 4) * 255.0);
      pCVar3[uVar6].g = (uchar)(int)(*(float *)((long)image.data + lVar5 * 4 + 4) * 255.0);
      pCVar3[uVar6].b = (uchar)(int)(*(float *)((long)image.data + lVar5 * 4 + 8) * 255.0);
      fVar9 = *(float *)((long)image.data + lVar5 * 4 + 0xc);
      goto LAB_0017b170;
    case 0xb:
      fVar9 = HalfToFloat(*(unsigned_short *)((long)image.data + lVar5 * 2));
LAB_0017b293:
      pCVar3[uVar6].r = (uchar)(int)(fVar9 * 255.0);
      pCVar3[uVar6].g = '\0';
      pCVar3[uVar6].b = '\0';
      pCVar3[uVar6].a = 0xff;
      iVar4 = iVar4 + 1;
      break;
    case 0xc:
      fVar9 = HalfToFloat(*(unsigned_short *)((long)image.data + lVar5 * 2));
      pCVar3[uVar6].r = (uchar)(int)(fVar9 * 255.0);
      fVar9 = HalfToFloat(*(unsigned_short *)((long)image.data + lVar5 * 2 + 2));
      pCVar3[uVar6].g = (uchar)(int)(fVar9 * 255.0);
      fVar9 = HalfToFloat(*(unsigned_short *)((long)image.data + lVar5 * 2 + 4));
LAB_0017b2ed:
      pCVar3[uVar6].b = (uchar)(int)(fVar9 * 255.0);
LAB_0017b2f6:
      pCVar3[uVar6].a = 0xff;
      iVar4 = iVar4 + 3;
      break;
    case 0xd:
      fVar9 = HalfToFloat(*(unsigned_short *)((long)image.data + lVar5 * 2));
      pCVar3[uVar6].r = (uchar)(int)(fVar9 * 255.0);
      fVar9 = HalfToFloat(*(unsigned_short *)((long)image.data + lVar5 * 2 + 2));
      pCVar3[uVar6].g = (uchar)(int)(fVar9 * 255.0);
      fVar9 = HalfToFloat(*(unsigned_short *)((long)image.data + lVar5 * 2 + 4));
      pCVar3[uVar6].b = (uchar)(int)(fVar9 * 255.0);
      fVar9 = HalfToFloat(*(unsigned_short *)((long)image.data + lVar5 * 2 + 6));
LAB_0017b170:
      pCVar3[uVar6].a = (uchar)(int)(fVar9 * 255.0);
LAB_0017b27d:
      iVar4 = iVar4 + 4;
    }
LAB_0017b301:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

Color *LoadImageColors(Image image)
{
    if ((image.width == 0) || (image.height == 0)) return NULL;

    Color *pixels = (Color *)RL_MALLOC(image.width*image.height*sizeof(Color));

    if (image.format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "IMAGE: Pixel data retrieval not supported for compressed image formats");
    else
    {
        if ((image.format == PIXELFORMAT_UNCOMPRESSED_R32) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32A32)) TRACELOG(LOG_WARNING, "IMAGE: Pixel format converted from 32bit to 8bit per channel");

        if ((image.format == PIXELFORMAT_UNCOMPRESSED_R16) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R16G16B16) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R16G16B16A16)) TRACELOG(LOG_WARNING, "IMAGE: Pixel format converted from 16bit to 8bit per channel");

        for (int i = 0, k = 0; i < image.width*image.height; i++)
        {
            switch (image.format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    pixels[i].r = ((unsigned char *)image.data)[i];
                    pixels[i].g = ((unsigned char *)image.data)[i];
                    pixels[i].b = ((unsigned char *)image.data)[i];
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    pixels[i].r = ((unsigned char *)image.data)[k];
                    pixels[i].g = ((unsigned char *)image.data)[k];
                    pixels[i].b = ((unsigned char *)image.data)[k];
                    pixels[i].a = ((unsigned char *)image.data)[k + 1];

                    k += 2;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111100000000000) >> 11)*(255/31));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000011111000000) >> 6)*(255/31));
                    pixels[i].b = (unsigned char)((float)((pixel & 0b0000000000111110) >> 1)*(255/31));
                    pixels[i].a = (unsigned char)((pixel & 0b0000000000000001)*255);

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111100000000000) >> 11)*(255/31));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000011111100000) >> 5)*(255/63));
                    pixels[i].b = (unsigned char)((float)(pixel & 0b0000000000011111)*(255/31));
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111000000000000) >> 12)*(255/15));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000111100000000) >> 8)*(255/15));
                    pixels[i].b = (unsigned char)((float)((pixel & 0b0000000011110000) >> 4)*(255/15));
                    pixels[i].a = (unsigned char)((float)(pixel & 0b0000000000001111)*(255/15));

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    pixels[i].r = ((unsigned char *)image.data)[k];
                    pixels[i].g = ((unsigned char *)image.data)[k + 1];
                    pixels[i].b = ((unsigned char *)image.data)[k + 2];
                    pixels[i].a = ((unsigned char *)image.data)[k + 3];

                    k += 4;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    pixels[i].r = (unsigned char)((unsigned char *)image.data)[k];
                    pixels[i].g = (unsigned char)((unsigned char *)image.data)[k + 1];
                    pixels[i].b = (unsigned char)((unsigned char *)image.data)[k + 2];
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = 0;
                    pixels[i].b = 0;
                    pixels[i].a = 255;

                    k += 1;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = (unsigned char)(((float *)image.data)[k + 1]*255.0f);
                    pixels[i].b = (unsigned char)(((float *)image.data)[k + 2]*255.0f);
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = (unsigned char)(((float *)image.data)[k + 1]*255.0f);
                    pixels[i].b = (unsigned char)(((float *)image.data)[k + 2]*255.0f);
                    pixels[i].a = (unsigned char)(((float *)image.data)[k + 3]*255.0f);

                    k += 4;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16:
                {
                    pixels[i].r = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k])*255.0f);
                    pixels[i].g = 0;
                    pixels[i].b = 0;
                    pixels[i].a = 255;

                    k += 1;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16G16B16:
                {
                    pixels[i].r = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k])*255.0f);
                    pixels[i].g = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k + 1])*255.0f);
                    pixels[i].b = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k + 2])*255.0f);
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16G16B16A16:
                {
                    pixels[i].r = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k])*255.0f);
                    pixels[i].g = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k + 1])*255.0f);
                    pixels[i].b = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k + 2])*255.0f);
                    pixels[i].a = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k + 3])*255.0f);

                    k += 4;
                } break;
                default: break;
            }
        }
    }

    return pixels;
}